

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int *piVar2;
  int __flags;
  long in_RSI;
  Mat *in_RDI;
  void *in_R8;
  Mat borderm;
  Mat m;
  int q;
  int left;
  int top;
  Mat bottom_blob_sliced;
  int _outc;
  int _outh;
  int _outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Mat *in_stack_fffffffffffffea0;
  int local_f4;
  Mat local_d8;
  undefined1 local_98 [64];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x28);
  local_40 = *(long *)(in_RSI + 0x10);
  if (*(int *)((long)&in_RDI[2].refcount + 4) == -0xe9) {
    local_44 = local_2c - *(int *)&in_RDI[2].data;
  }
  else if (*(int *)((long)&in_RDI[2].refcount + 4) == -0xea) {
    local_44 = (local_2c + -1) - *(int *)&in_RDI[2].data;
  }
  else {
    local_50 = local_2c - *(int *)&in_RDI[2].data;
    piVar2 = std::min<int>((int *)((long)&in_RDI[2].refcount + 4),&local_50);
    local_44 = *piVar2;
  }
  if ((int)in_RDI[2].elemsize == -0xe9) {
    local_48 = local_30 - *(int *)((long)&in_RDI[2].data + 4);
  }
  else if ((int)in_RDI[2].elemsize == -0xea) {
    local_48 = (local_30 + -1) - *(int *)((long)&in_RDI[2].data + 4);
  }
  else {
    local_54 = local_30 - *(int *)((long)&in_RDI[2].data + 4);
    piVar2 = std::min<int>((int *)&in_RDI[2].elemsize,&local_54);
    local_48 = *piVar2;
  }
  if (*(int *)((long)&in_RDI[2].elemsize + 4) == -0xe9) {
    local_4c = local_34 - *(int *)&in_RDI[2].refcount;
  }
  else if (*(int *)((long)&in_RDI[2].elemsize + 4) == -0xea) {
    local_4c = (local_34 + -1) - *(int *)&in_RDI[2].refcount;
  }
  else {
    local_58 = local_34 - *(int *)&in_RDI[2].refcount;
    piVar2 = std::min<int>((int *)((long)&in_RDI[2].elemsize + 4),&local_58);
    local_4c = *piVar2;
  }
  if (((local_44 == local_2c) && (local_48 == local_30)) && (local_4c == local_34)) {
    Mat::operator=(in_stack_fffffffffffffe88,in_RDI);
    return 0;
  }
  __flags = local_4c;
  Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
  if ((local_44 == local_2c) && (local_48 == local_30)) {
    Mat::clone(&local_d8,(__fn *)local_98,(void *)0x0,__flags,in_R8);
    Mat::operator=(in_stack_fffffffffffffe88,in_RDI);
    Mat::~Mat((Mat *)0x15a780);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      local_4 = -100;
      goto LAB_0015aaa3;
    }
  }
  if (local_38 == 2) {
    Mat::create(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                (Allocator *)in_stack_fffffffffffffe88);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      local_4 = -100;
      goto LAB_0015aaa3;
    }
    if (local_40 == 1) {
      copy_cut_border_image<signed_char>
                (in_stack_fffffffffffffea0,
                 (Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    }
    else if (local_40 == 4) {
      copy_cut_border_image<float>
                (in_stack_fffffffffffffea0,
                 (Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    }
  }
  if (local_38 == 3) {
    Mat::create(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                in_stack_fffffffffffffe94,(size_t)in_stack_fffffffffffffe88,(Allocator *)in_RDI);
    bVar1 = Mat::empty(in_RDI);
    if (bVar1) {
      local_4 = -100;
      goto LAB_0015aaa3;
    }
    for (local_f4 = 0; local_f4 < local_34; local_f4 = local_f4 + 1) {
      Mat::channel(in_stack_fffffffffffffe88,(int)((ulong)in_RDI >> 0x20));
      Mat::channel(in_stack_fffffffffffffe88,(int)((ulong)in_RDI >> 0x20));
      if (local_40 == 1) {
        copy_cut_border_image<signed_char>
                  (in_stack_fffffffffffffea0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
      }
      else if (local_40 == 4) {
        copy_cut_border_image<float>
                  (in_stack_fffffffffffffea0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
      }
      Mat::~Mat((Mat *)0x15aa5f);
      Mat::~Mat((Mat *)0x15aa69);
    }
  }
  local_4 = 0;
LAB_0015aaa3:
  Mat::~Mat((Mat *)0x15aab0);
  return local_4;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _outw;
    int _outh;
    int _outc;

    if (outw == -233)
        _outw = w - woffset;
    else if (outw == -234)
        _outw = w - 1 - woffset;
    else
        _outw = std::min(outw, w - woffset);

    if (outh == -233)
        _outh = h - hoffset;
    else if (outh == -234)
        _outh = h - 1 - hoffset;
    else
        _outh = std::min(outh, h - hoffset);

    if (outc == -233)
        _outc = channels - coffset;
    else if (outc == -234)
        _outc = channels - 1 - coffset;
    else
        _outc = std::min(outc, channels - coffset);

    if (_outw == w && _outh == h && _outc == channels)
    {
        top_blob = bottom_blob;
        return 0;
    }

    const Mat bottom_blob_sliced = bottom_blob.channel_range(coffset, _outc);

    if (_outw == w && _outh == h)
    {
        top_blob = bottom_blob_sliced.clone();
        if (top_blob.empty())
            return -100;
    }

    int top = hoffset;
    int left = woffset;

    if (dims == 2)
    {
        top_blob.create(_outh, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob_sliced, top_blob, top, left);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob_sliced, top_blob, top, left);
    }

    if (dims == 3)
    {
        top_blob.create(_outw, _outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, top, left);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, top, left);
        }
    }

    return 0;
}